

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sspm.cpp
# Opt level: O0

void __thiscall pg::SSPMSolver::stream_tmp(SSPMSolver *this,ostream *out,int h)

{
  ostream *poVar1;
  bool bVar2;
  undefined1 local_58 [28];
  int val;
  int d;
  int i;
  int local_28;
  int local_24;
  int c;
  int i_1;
  int j;
  int h_local;
  ostream *out_local;
  SSPMSolver *this_local;
  
  i_1 = h;
  _j = out;
  out_local = (ostream *)this;
  if (*this->tmp_d == -1) {
    std::operator<<(out," \x1b[1;33mTop\x1b[m");
  }
  else {
    std::operator<<(out," { ");
    c = 0;
    for (local_24 = 0; local_24 < i_1; local_24 = local_24 + 1) {
      if (0 < local_24) {
        std::operator<<(_j,",");
      }
      local_28 = 0;
      while( true ) {
        poVar1 = _j;
        bVar2 = false;
        if (c < this->l) {
          bVar2 = this->tmp_d[c] == local_24;
        }
        if (!bVar2) break;
        local_28 = local_28 + 1;
        bitset::operator[]((bitset *)&d,(size_t)&this->tmp_b);
        bVar2 = bitset::reference::operator_cast_to_bool((reference *)&d);
        std::ostream::operator<<(poVar1,bVar2);
        c = c + 1;
      }
      if (local_28 == 0) {
        std::operator<<(_j,anon_var_dwarf_184c97);
      }
    }
    std::operator<<(_j," }");
    std::operator<<(_j," {");
    val = 0;
    for (local_58._24_4_ = 0; (int)local_58._24_4_ < i_1; local_58._24_4_ = local_58._24_4_ + 1) {
      local_58._20_4_ = 0;
      for (; val < this->l; val = val + 1) {
        if (this->tmp_d[val] != local_58._24_4_) {
          local_58._20_4_ = (1 << ((char)this->l - (char)val & 0x1fU)) - 1U | local_58._20_4_;
          break;
        }
        bitset::operator[]((bitset *)local_58,(size_t)&this->tmp_b);
        bVar2 = bitset::reference::operator_cast_to_bool((reference *)local_58);
        if (bVar2) {
          local_58._20_4_ = 1 << ((char)this->l - (char)val & 0x1fU) | local_58._20_4_;
        }
      }
      poVar1 = std::operator<<((this->super_Solver).logger," ");
      std::ostream::operator<<(poVar1,local_58._20_4_);
    }
    std::operator<<(_j," }");
  }
  return;
}

Assistant:

void
SSPMSolver::stream_tmp(std::ostream &out, int h)
{
    if (tmp_d[0] == -1) {
        out << " \033[1;33mTop\033[m";
    } else {
        out << " { ";
        int j=0;
        for (int i=0; i<h; i++) {
            if (i>0) out << ",";
            int c=0;
            while (j<l and tmp_d[j] == i) {
                c++;
                out << tmp_b[j];
                j++;
            }
            if (c == 0) out << "ε";
        }
        out << " }";

        out << " {";

        // compute value
        int i=0;
        for (int d=0; d<h; d++) {
            int val = 0;

            for (; i<l; i++) {
                if (tmp_d[i] != d) {
                    // e found
                    val |= ((1 << (l-i)) - 1);
                    break;
                }

                if (tmp_b[i]) val |= (1 << (l-i));
            }

            logger << " " << val;
        }

        out << " }";
    }
}